

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

bool __thiscall PhyloTree::removeSplit(PhyloTree *this,Bipartition *e)

{
  pointer pPVar1;
  bool bVar2;
  long lVar3;
  ulong index;
  
  lVar3 = 0;
  bVar2 = false;
  index = 0;
  while( true ) {
    pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((ulong)(((long)(this->edges).
                        super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pPVar1) / 0x48) <= index) ||
       (bVar2 != false)) break;
    bVar2 = PhyloTreeEdge::sameBipartition
                      ((PhyloTreeEdge *)
                       ((long)&(pPVar1->super_Bipartition)._vptr_Bipartition + lVar3),e);
    if (bVar2) {
      Tools::vector_remove_element_at_index<PhyloTreeEdge>(&this->edges,index);
    }
    index = index + 1;
    lVar3 = lVar3 + 0x48;
  }
  return bVar2;
}

Assistant:

bool PhyloTree::removeSplit(const Bipartition &e) {
    bool removed = false;
    size_t i = 0;
    while (i < edges.size() && !removed) {
        if (edges[i].sameBipartition(e)) {
            Tools::vector_remove_element_at_index(edges, i);
            removed = true;
        }
        i++;
    }
    return removed;
}